

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_range.c
# Opt level: O0

CURLcode Curl_range(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLofft CVar2;
  int iVar3;
  CURLofft CVar4;
  bool bVar5;
  curl_off_t totalsize;
  CURLofft to_t;
  CURLofft from_t;
  Curl_easy *data;
  char *ptr2;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  if (((*(ushort *)&(pCVar1->state).field_0x4e4 >> 9 & 1) == 0) ||
     ((pCVar1->state).range == (char *)0x0)) {
    (pCVar1->req).maxdownload = -1;
  }
  else {
    from = (curl_off_t)conn;
    CVar2 = curlx_strtoofft((pCVar1->state).range,&ptr2,0,&to);
    if (CVar2 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    while( true ) {
      bVar5 = false;
      if (*ptr2 != '\0') {
        iVar3 = Curl_isspace((uint)(byte)*ptr2);
        bVar5 = true;
        if (iVar3 == 0) {
          bVar5 = *ptr2 == '-';
        }
      }
      if (!bVar5) break;
      ptr2 = ptr2 + 1;
    }
    CVar4 = curlx_strtoofft(ptr2,(char **)&data,0,(curl_off_t *)&ptr);
    if (CVar4 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    if ((CVar4 == CURL_OFFT_INVAL) && (CVar2 == CURL_OFFT_OK)) {
      (pCVar1->state).resume_from = to;
    }
    else if ((CVar2 == CURL_OFFT_INVAL) && (CVar4 == CURL_OFFT_OK)) {
      (pCVar1->req).maxdownload = (curl_off_t)ptr;
      (pCVar1->state).resume_from = -(long)ptr;
    }
    else {
      if ((long)ptr < to) {
        return CURLE_RANGE_ERROR;
      }
      if ((long)ptr - to == 0x7fffffffffffffff) {
        return CURLE_RANGE_ERROR;
      }
      (pCVar1->req).maxdownload = ((long)ptr - to) + 1;
      (pCVar1->state).resume_from = to;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_range(struct connectdata *conn)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;
  struct Curl_easy *data = conn->data;

  if(data->state.use_range && data->state.range) {
    CURLofft from_t;
    CURLofft to_t;
    from_t = curlx_strtoofft(data->state.range, &ptr, 0, &from);
    if(from_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    while(*ptr && (ISSPACE(*ptr) || (*ptr == '-')))
      ptr++;
    to_t = curlx_strtoofft(ptr, &ptr2, 0, &to);
    if(to_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    if((to_t == CURL_OFFT_INVAL) && !from_t) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" CURL_FORMAT_CURL_OFF_T " to end of file\n",
                   from));
    }
    else if((from_t == CURL_OFFT_INVAL) && !to_t) {
      /* -Y */
      data->req.maxdownload = to;
      data->state.resume_from = -to;
      DEBUGF(infof(data, "RANGE the last %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   to));
    }
    else {
      /* X-Y */
      curl_off_t totalsize;

      /* Ensure the range is sensible - to should follow from. */
      if(from > to)
        return CURLE_RANGE_ERROR;

      totalsize = to - from;
      if(totalsize == CURL_OFF_T_MAX)
        return CURLE_RANGE_ERROR;

      data->req.maxdownload = totalsize + 1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" CURL_FORMAT_CURL_OFF_T
                   " getting %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" CURL_FORMAT_CURL_OFF_T
                 " to %" CURL_FORMAT_CURL_OFF_T ", totally %"
                 CURL_FORMAT_CURL_OFF_T " bytes\n",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}